

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

string * __thiscall
CentralBroker::getAddress_abi_cxx11_(string *__return_storage_ptr__,CentralBroker *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->address);
  return __return_storage_ptr__;
}

Assistant:

std::string CentralBroker::getAddress() const
{
    return address;
}